

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          ArrayPtr<const_char> *params_3,CappedArray<char,_26UL> *params_4,
          ArrayPtr<const_char> *params_5,CappedArray<char,_26UL> *params_6)

{
  long lVar1;
  size_t size;
  char *target;
  long local_68 [2];
  char *local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_68[0] = *(long *)this;
  local_68[1] = *(undefined8 *)params->content;
  local_58 = params_1->ptr;
  local_50 = *(undefined8 *)params_2->content;
  local_48 = params_3->ptr;
  local_40 = *(undefined8 *)params_4->content;
  local_38 = params_5->ptr;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_68 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x38);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (target,(CappedArray<char,_14UL> *)this,(ArrayPtr<const_char> *)params,
             (CappedArray<char,_14UL> *)params_1,(ArrayPtr<const_char> *)params_2,
             (CappedArray<char,_26UL> *)params_3,(ArrayPtr<const_char> *)params_4,
             (CappedArray<char,_26UL> *)params_5);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}